

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipc.c
# Opt level: O0

void nn_cipc_destroy(void *self)

{
  nn_cipc *cipc;
  
  nn_sipc_term((nn_sipc *)0x13d784);
  nn_backoff_term((nn_backoff *)0x13d795);
  nn_usock_term((nn_usock *)0x13d7a3);
  nn_fsm_term((nn_fsm *)0x13d7ad);
  nn_free((void *)0x13d7b7);
  return;
}

Assistant:

static void nn_cipc_destroy (void *self)
{
    struct nn_cipc *cipc = self;

    nn_sipc_term (&cipc->sipc);
    nn_backoff_term (&cipc->retry);
    nn_usock_term (&cipc->usock);
    nn_fsm_term (&cipc->fsm);

    nn_free (cipc);
}